

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::SetTests
          (cmCTestMultiProcessHandler *this,TestMap *tests,PropertiesMap *properties)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  mapped_type_conflict1 *pmVar4;
  _Self local_30;
  _Self local_28;
  iterator i;
  PropertiesMap *properties_local;
  TestMap *tests_local;
  cmCTestMultiProcessHandler *this_local;
  
  i._M_node = (_Base_ptr)properties;
  TestMap::operator=(&this->Tests,tests);
  PropertiesMap::operator=(&this->Properties,(PropertiesMap *)i._M_node);
  sVar2 = std::
          map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
          ::size(&(this->Tests).
                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                );
  this->Total = sVar2;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ::begin(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
         ::end(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator->(&local_28);
    pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestRunningMap,&ppVar3->first);
    *pmVar4 = false;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator->(&local_28);
    pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestFinishMap,&ppVar3->first);
    *pmVar4 = false;
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&local_28);
  }
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  if (!bVar1) {
    ReadCostData(this);
    bVar1 = CheckCycles(this);
    this->HasCycles = (bool)((bVar1 ^ 0xffU) & 1);
    if ((this->HasCycles & 1U) == 0) {
      CreateTestCostList(this);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetTests(TestMap& tests,
                                          PropertiesMap& properties)
{
  this->Tests = tests;
  this->Properties = properties;
  this->Total = this->Tests.size();
  // set test run map to false for all
  for (TestMap::iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    this->TestRunningMap[i->first] = false;
    this->TestFinishMap[i->first] = false;
  }
  if (!this->CTest->GetShowOnly()) {
    this->ReadCostData();
    this->HasCycles = !this->CheckCycles();
    if (this->HasCycles) {
      return;
    }
    this->CreateTestCostList();
  }
}